

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPParser.cpp
# Opt level: O1

SNMP_ERROR_RESPONSE
handlePacket(uint8_t *buffer,int packetLength,int *responseLength,int max_packet_size,
            deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,string *_community,
            string *_readOnlyCommunity,informCB informCallback,void *ctx)

{
  size_t sVar1;
  _Elt_pointer pVVar2;
  bool bVar3;
  SNMP_PACKET_PARSE_ERROR SVar4;
  int iVar5;
  _Map_pointer ppVVar6;
  SNMP_ERROR_STATUS error;
  VarBind *item;
  VarBind *response_00;
  VarBind *pVVar8;
  SNMP_ERROR_RESPONSE SVar9;
  char cVar10;
  deque<VarBind,_std::allocator<VarBind>_> outResponseList;
  SNMPPacket request;
  SNMPResponse response;
  _Deque_base<VarBind,_std::allocator<VarBind>_> local_238;
  SNMPPacket local_1e0;
  SNMPPacket local_108;
  SNMP_ERROR_STATUS SVar7;
  
  SNMPPacket::SNMPPacket(&local_1e0);
  SVar4 = SNMPPacket::parseFrom(&local_1e0,buffer,(long)packetLength);
  if (SVar4 < 1) {
    SVar9 = SNMP_REQUEST_INVALID;
    goto LAB_001088d9;
  }
  if (local_1e0.packetPDUType == GetResponsePDU) {
    SVar9 = SNMP_INFORM_RESPONSE_OCCURRED;
    if (informCallback != (informCB)0x0) {
      (*informCallback)(ctx,local_1e0.requestID,local_1e0.errorStatus.errorStatus == NO_ERROR);
    }
    goto LAB_001088d9;
  }
  sVar1 = _readOnlyCommunity->_M_string_length;
  cVar10 = false;
  if (sVar1 == local_1e0.communityString._M_string_length && sVar1 != 0) {
    iVar5 = bcmp((_readOnlyCommunity->_M_dataplus)._M_p,local_1e0.communityString._M_dataplus._M_p,
                 sVar1);
    cVar10 = iVar5 == 0;
  }
  sVar1 = _community->_M_string_length;
  if (sVar1 == local_1e0.communityString._M_string_length) {
    if (sVar1 == 0) {
      cVar10 = '\x02';
    }
    else {
      iVar5 = bcmp((_community->_M_dataplus)._M_p,local_1e0.communityString._M_dataplus._M_p,sVar1);
      if (iVar5 == 0) {
        cVar10 = '\x02';
      }
    }
  }
  if (cVar10 == '\0') {
    SVar9 = SNMP_REQUEST_INVALID_COMMUNITY;
    goto LAB_001088d9;
  }
  SNMPResponse::SNMPResponse((SNMPResponse *)&local_108,&local_1e0);
  local_238._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_finish._M_cur = (VarBind *)0x0;
  local_238._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_last = (VarBind *)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_cur = (VarBind *)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<VarBind,_std::allocator<VarBind>_>::_M_initialize_map(&local_238,0);
  SVar7 = GEN_ERR;
  error = GEN_ERR;
  if (local_1e0.packetPDUType - GetRequestPDU < 2) {
    bVar3 = handleGetRequestPDU(callbacks,&local_1e0.varbindList,
                                (deque<VarBind,_std::allocator<VarBind>_> *)&local_238,
                                local_1e0.snmpVersion,local_1e0.packetPDUType == GetNextRequestPDU);
    SVar9 = (uint)(local_1e0.packetPDUType == GetRequestPDU) ^ SNMP_GETNEXT_OCCURRED;
  }
  else if (local_1e0.packetPDUType == SetRequestPDU) {
    if (cVar10 != '\x02') {
      SVar7 = NO_ACCESS;
LAB_001087f6:
      SVar9 = SNMP_NO_ERROR;
      error = SVar7;
      goto LAB_001087fc;
    }
    bVar3 = handleSetRequestPDU(callbacks,&local_1e0.varbindList,
                                (deque<VarBind,_std::allocator<VarBind>_> *)&local_238,
                                local_1e0.snmpVersion);
    SVar9 = SNMP_SET_OCCURRED;
    error = GEN_ERR;
  }
  else if (local_1e0.packetPDUType == GetBulkRequestPDU) {
    if (local_1e0.snmpVersion != SNMP_VERSION_2C) goto LAB_001087f6;
    bVar3 = handleGetBulkRequestPDU
                      (callbacks,&local_1e0.varbindList,
                       (deque<VarBind,_std::allocator<VarBind>_> *)&local_238,
                       local_1e0.errorStatus.errorStatus,local_1e0.errorIndex.errorIndex);
    SVar9 = SNMP_GETBULK_OCCURRED;
  }
  else {
    SVar9 = SNMP_UNKNOWN_PDU_OCCURRED;
    error = SVar7;
LAB_001087fc:
    bVar3 = false;
  }
  pVVar2 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (bVar3 == false) {
    SVar9 = SNMP_ERROR_PACKET_SENT;
    SNMPResponse::setGlobalError((SNMPResponse *)&local_108,error,0,1);
  }
  else if (local_238._M_impl.super__Deque_impl_data._M_start._M_cur !=
           local_238._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    ppVVar6 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
    response_00 = local_238._M_impl.super__Deque_impl_data._M_start._M_cur;
    pVVar8 = local_238._M_impl.super__Deque_impl_data._M_start._M_last;
    do {
      if (response_00->errorStatus == NO_ERROR) {
        SNMPResponse::addResponse((SNMPResponse *)&local_108,response_00);
      }
      else {
        SNMPResponse::addErrorResponse((SNMPResponse *)&local_108,response_00);
      }
      response_00 = response_00 + 1;
      if (response_00 == pVVar8) {
        response_00 = ppVVar6[1];
        ppVVar6 = ppVVar6 + 1;
        pVVar8 = response_00 + 10;
      }
    } while (response_00 != pVVar2);
  }
  memset(buffer,0,(long)max_packet_size);
  iVar5 = SNMPPacket::serialiseInto(&local_108,buffer,(long)max_packet_size);
  *responseLength = iVar5;
  if (iVar5 < 1) {
    SVar9 = SNMP_FAILED_SERIALISATION;
  }
  std::deque<VarBind,_std::allocator<VarBind>_>::~deque
            ((deque<VarBind,_std::allocator<VarBind>_> *)&local_238);
  SNMPPacket::~SNMPPacket(&local_108);
LAB_001088d9:
  SNMPPacket::~SNMPPacket(&local_1e0);
  return SVar9;
}

Assistant:

SNMP_ERROR_RESPONSE handlePacket(uint8_t* buffer, int packetLength, int* responseLength, int max_packet_size, std::deque<ValueCallback*> &callbacks, const std::string& _community, const std::string& _readOnlyCommunity, informCB informCallback, void* ctx){
    SNMPPacket request;

    SNMP_PACKET_PARSE_ERROR parseResult = request.parseFrom(buffer, packetLength);
    if(parseResult <= 0){
        SNMP_LOGW("Received Error code: %d when attempting to parse\n", parseResult);
        return SNMP_REQUEST_INVALID;
    }

    SNMP_LOGD("Valid SNMP Packet!");

    if(request.packetPDUType == GetResponsePDU){
        SNMP_LOGD("Received GetResponse! probably as a result of a recent InformTrap: %lu", request.requestID);
        if(informCallback){
            informCallback(ctx, request.requestID, !request.errorStatus.errorStatus);
        } else {
            SNMP_LOGW("Not sure what to do with Inform\n");
        }
        return SNMP_INFORM_RESPONSE_OCCURRED;
    }

    SNMP_PERMISSION requestPermission = getPermissionOfRequest(request, _community, _readOnlyCommunity);
    if(requestPermission == SNMP_PERM_NONE){
        SNMP_LOGW("Invalid communitystring provided: %s, no response to give\n", request.communityString.c_str());
        return SNMP_REQUEST_INVALID_COMMUNITY;
    }
    
    // this will take the required stuff from request - like requestID and community string etc
    SNMPResponse response = SNMPResponse(request);

    std::deque<VarBind> outResponseList;

    bool pass = false;
    SNMP_ERROR_RESPONSE handleStatus = SNMP_NO_ERROR;
    SNMP_ERROR_STATUS globalError = GEN_ERR;

    switch(request.packetPDUType){
        case GetRequestPDU:
        case GetNextRequestPDU:
            pass = handleGetRequestPDU(callbacks, request.varbindList, outResponseList, request.snmpVersion, request.packetPDUType == GetNextRequestPDU);
            handleStatus = request.packetPDUType == GetRequestPDU ? SNMP_GET_OCCURRED : SNMP_GETNEXT_OCCURRED;
        break;
        case GetBulkRequestPDU:
            if(request.snmpVersion != SNMP_VERSION_2C){
                SNMP_LOGD("Received GetBulkRequest in SNMP_VERSION_1");
                pass = false;
                globalError = GEN_ERR;
            } else {
                pass = handleGetBulkRequestPDU(callbacks, request.varbindList, outResponseList, request.errorStatus.nonRepeaters, request.errorIndex.maxRepititions);
                handleStatus = SNMP_GETBULK_OCCURRED;
            }
        break;
        case SetRequestPDU:
            if(requestPermission != SNMP_PERM_READ_WRITE){
                SNMP_LOGD("Attempting to perform a SET without required permissions");
                pass = false;
                globalError = NO_ACCESS;
            } else {
                pass = handleSetRequestPDU(callbacks, request.varbindList, outResponseList, request.snmpVersion);
                handleStatus = SNMP_SET_OCCURRED;
            }
        break;
        default:
            SNMP_LOGD("Not sure what to do with SNMP PDU of type: %d\n", request.packetPDUType);
            handleStatus = SNMP_UNKNOWN_PDU_OCCURRED;
            pass = false;
        break;
    }

    if(pass){
        for(const auto& item : outResponseList){
            if(item.errorStatus != NO_ERROR){
                response.addErrorResponse(item);
            } else {
                response.addResponse(item);
            }
        }
    } else {
        // Something went wrong, generic error response
        SNMP_LOGD("Handled error when building request, error: %d, sending error PDU", globalError);
        response.setGlobalError(globalError, 0, true);
        handleStatus = SNMP_ERROR_PACKET_SENT;
    }

    memset(buffer, 0, max_packet_size);

    *responseLength = response.serialiseInto(buffer, max_packet_size);
    if(*responseLength <= 0){
        SNMP_LOGD("Failed to build response packet");
        return SNMP_FAILED_SERIALISATION;
    }

    return handleStatus;
}